

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterop.cpp
# Opt level: O0

void anon_unknown.dwarf_d07c3::testInteropMx2(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  float *pfVar4;
  Matrix22<float> v;
  int i;
  int j;
  SimpleMx<float,_2> s;
  Matrix22<float> ref;
  float in_stack_ffffffffffffffc8 [2];
  float in_stack_ffffffffffffffd0 [2];
  int in_stack_ffffffffffffffd8;
  int i_00;
  float in_stack_ffffffffffffffe0 [2];
  Matrix22<float> local_10;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<SimpleMx<float,2>, float, 2, 2>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<SimpleMx<int,2>, float, 2, 2>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<SimpleMx<float,2>, float, 4, 4>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<xyzw<float>, float, 2, 2>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "has_double_subscript<xyz_wrong<float>, float, 2, 2>::value = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  Imath_3_2::Matrix22<float>::Matrix22(&local_10);
  SimpleMx<float,_2>::SimpleMx((SimpleMx<float,_2> *)&stack0xffffffffffffffe0,0.0);
  for (i_00 = 0; i_00 < 2; i_00 = i_00 + 1) {
    for (in_stack_ffffffffffffffd8 = 0; in_stack_ffffffffffffffd8 < 2;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
      iVar2 = in_stack_ffffffffffffffd8 + i_00 * 2;
      pfVar4 = SimpleMx<float,_2>::operator[]((SimpleMx<float,_2> *)&stack0xffffffffffffffe0,i_00);
      pfVar4[in_stack_ffffffffffffffd8] = (float)iVar2;
      iVar2 = in_stack_ffffffffffffffd8 + i_00 * 2;
      pfVar4 = Imath_3_2::Matrix22<float>::operator[](&local_10,i_00);
      pfVar4[in_stack_ffffffffffffffd8] = (float)iVar2;
    }
  }
  Imath_3_2::Matrix22<float>::Matrix22<(anonymous_namespace)::SimpleMx<float,_2>,_0>
            ((Matrix22<float> *)in_stack_ffffffffffffffd0,
             (SimpleMx<float,_2> *)in_stack_ffffffffffffffc8);
  pfVar4 = Imath_3_2::Matrix22<float>::operator[]((Matrix22<float> *)&stack0xffffffffffffffc8,0);
  bVar1 = false;
  if ((*pfVar4 == 0.0) && (!NAN(*pfVar4))) {
    pfVar4 = Imath_3_2::Matrix22<float>::operator[]((Matrix22<float> *)&stack0xffffffffffffffc8,0);
    bVar1 = false;
    if ((pfVar4[1] == 1.0) && (!NAN(pfVar4[1]))) {
      pfVar4 = Imath_3_2::Matrix22<float>::operator[]((Matrix22<float> *)&stack0xffffffffffffffc8,1)
      ;
      bVar1 = false;
      if ((*pfVar4 == 2.0) && (!NAN(*pfVar4))) {
        pfVar4 = Imath_3_2::Matrix22<float>::operator[]
                           ((Matrix22<float> *)&stack0xffffffffffffffc8,1);
        bVar1 = pfVar4[1] == 3.0;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("v[0][0] == 0 && v[0][1] == 1 && v[1][0] == 2 && v[1][1] == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x24e,"void (anonymous namespace)::testInteropMx2()");
  }
  pfVar4 = SimpleMx<float,_2>::operator[]((SimpleMx<float,_2> *)&stack0xffffffffffffffe0,1);
  pfVar4[1] = 42.0;
  Imath_3_2::Matrix22<float>::operator=<(anonymous_namespace)::SimpleMx<float,_2>,_0>
            ((Matrix22<float> *)in_stack_ffffffffffffffe0,
             (SimpleMx<float,_2> *)CONCAT44(i_00,in_stack_ffffffffffffffd8));
  pfVar4 = Imath_3_2::Matrix22<float>::operator[]((Matrix22<float> *)&stack0xffffffffffffffc8,0);
  bVar1 = false;
  if ((*pfVar4 == 0.0) && (!NAN(*pfVar4))) {
    pfVar4 = Imath_3_2::Matrix22<float>::operator[]((Matrix22<float> *)&stack0xffffffffffffffc8,0);
    bVar1 = false;
    if ((pfVar4[1] == 1.0) && (!NAN(pfVar4[1]))) {
      pfVar4 = Imath_3_2::Matrix22<float>::operator[]((Matrix22<float> *)&stack0xffffffffffffffc8,1)
      ;
      bVar1 = false;
      if ((*pfVar4 == 2.0) && (!NAN(*pfVar4))) {
        pfVar4 = Imath_3_2::Matrix22<float>::operator[]
                           ((Matrix22<float> *)&stack0xffffffffffffffc8,1);
        bVar1 = pfVar4[1] == 42.0;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("v[0][0] == 0 && v[0][1] == 1 && v[1][0] == 2 && v[1][1] == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterop.cpp"
                  ,0x251,"void (anonymous namespace)::testInteropMx2()");
  }
  return;
}

Assistant:

void
testInteropMx2 ()
{
    std::cout
        << "has_double_subscript<SimpleMx<float,2>, float, 2, 2>::value = "
        << has_double_subscript<SimpleMx<float, 2>, float, 2, 2>::value << "\n";
    std::cout << "has_double_subscript<SimpleMx<int,2>, float, 2, 2>::value = "
              << has_double_subscript<SimpleMx<int, 2>, float, 2, 2>::value
              << "\n";
    std::cout
        << "has_double_subscript<SimpleMx<float,2>, float, 4, 4>::value = "
        << has_double_subscript<SimpleMx<float, 2>, float, 4, 4>::value << "\n";
    std::cout << "has_double_subscript<xyzw<float>, float, 2, 2>::value = "
              << has_double_subscript<xyzw<float>, float, 2, 2>::value << "\n";
    std::cout << "has_double_subscript<xyz_wrong<float>, float, 2, 2>::value = "
              << has_double_subscript<xyz_wrong<float>, float, 2, 2>::value
              << "\n";
    std::cout << "\n";

    assert ((has_double_subscript<SimpleMx<float, 2>, float, 2, 2>::value));
    assert ((!has_double_subscript<SimpleMx<float, 2>, float, 4, 4>::value));
    assert ((!has_double_subscript<SimpleMx<float, 2>, int, 2, 2>::value));
    assert ((!has_double_subscript<xyzw<float>, float, 2, 2>::value));
    assert ((!has_double_subscript<xy<float>, float, 2, 2>::value));

    // Test construction/assignment/paramater pass of a vector type with
    // subscripting to access components.
    {
        Matrix22<float>    ref;
        SimpleMx<float, 2> s;
        for (int j = 0; j < 2; ++j)
            for (int i = 0; i < 2; ++i)
            {
                s[j][i]   = float(i + j * 2);
                ref[j][i] = float(i + j * 2);
            }
        Matrix22<float> v (s);
        assert (v[0][0] == 0 && v[0][1] == 1 && v[1][0] == 2 && v[1][1] == 3);
        s[1][1] = 42;
        v       = s;
        assert (v[0][0] == 0 && v[0][1] == 1 && v[1][0] == 2 && v[1][1] == 42);
    }
}